

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

Wlc_Ntk_t * Wlc_ReadVer(char *pFileName,char *pStr)

{
  Wlc_Ntk_t *pWVar1;
  int iVar2;
  Wlc_Prs_t *p_00;
  Wlc_Obj_t *pObj_00;
  char *pcVar3;
  int local_3c;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNtk;
  Wlc_Prs_t *p;
  char *pStr_local;
  char *pFileName_local;
  
  pObj = (Wlc_Obj_t *)0x0;
  if ((pFileName == (char *)0x0) != (pStr == (char *)0x0)) {
    p_00 = Wlc_PrsStart(pFileName,pStr);
    if (p_00 == (Wlc_Prs_t *)0x0) {
      pFileName_local = (char *)0x0;
    }
    else {
      iVar2 = Wlc_PrsPrepare(p_00);
      if (((iVar2 != 0) && (iVar2 = Wlc_PrsDerive(p_00), iVar2 != 0)) &&
         (p_00->pNtk != (Wlc_Ntk_t *)0x0)) {
        for (local_3c = 1; iVar2 = Wlc_NtkObjNumMax(p_00->pNtk), local_3c < iVar2;
            local_3c = local_3c + 1) {
          pObj_00 = Wlc_NtkObj(p_00->pNtk,local_3c);
          if ((undefined1  [24])((undefined1  [24])*pObj_00 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x5) {
            pWVar1 = p_00->pNtk;
            iVar2 = Wlc_ObjId(p_00->pNtk,pObj_00);
            Vec_IntPush(&pWVar1->vFfs2,iVar2);
          }
        }
        pObj = (Wlc_Obj_t *)Wlc_NtkDupDfs(p_00->pNtk,0,1);
        pcVar3 = Abc_UtilStrsav(pFileName);
        ((Wlc_Ntk_t *)pObj)->pSpec = pcVar3;
      }
      Wlc_PrsPrintErrorMessage(p_00);
      Wlc_PrsStop(p_00);
      pFileName_local = (char *)pObj;
    }
    return (Wlc_Ntk_t *)pFileName_local;
  }
  __assert_fail("(pFileName == NULL) != (pStr == NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadVer.c"
                ,0x69a,"Wlc_Ntk_t *Wlc_ReadVer(char *, char *)");
}

Assistant:

Wlc_Ntk_t * Wlc_ReadVer( char * pFileName, char * pStr )
{
    Wlc_Prs_t * p;
    Wlc_Ntk_t * pNtk = NULL;
    // either file name or string is given
    assert( (pFileName == NULL) != (pStr == NULL) );
    // start the parser 
    p = Wlc_PrsStart( pFileName, pStr );
    if ( p == NULL )
        return NULL;
    // detect lines
    if ( !Wlc_PrsPrepare( p ) )
        goto finish;
    // parse models
    if ( !Wlc_PrsDerive( p ) )
        goto finish;
    // derive topological order
    if ( p->pNtk )
    {
        Wlc_Obj_t * pObj; int i;
        Wlc_NtkForEachObj( p->pNtk, pObj, i )
            if ( pObj->Type == WLC_OBJ_FF )
                Vec_IntPush( &p->pNtk->vFfs2, Wlc_ObjId(p->pNtk, pObj) );
        pNtk = Wlc_NtkDupDfs( p->pNtk, 0, 1 );
        pNtk->pSpec = Abc_UtilStrsav( pFileName );
    }
finish:
    Wlc_PrsPrintErrorMessage( p );
    Wlc_PrsStop( p );
    return pNtk;
}